

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

void share_setup_x11_channel
               (ssh_sharing_connstate *cs,share_channel *chan,uint upstream_id,uint server_id,
               uint server_currwin,uint server_maxpkt,uint client_adjusted_window,char *peer_addr,
               int peer_port,int endian,int protomajor,int protominor,void *initial_data,
               int initial_len)

{
  BinarySink *pBVar1;
  char *__src;
  ConnectionLayer *pCVar2;
  int iVar3;
  uint *e;
  uint *puVar4;
  void *data;
  strbuf *psVar5;
  undefined8 *puVar6;
  int greeting_len;
  
  e = (uint *)safemalloc(1,0x20,0);
  *e = upstream_id;
  e[1] = server_id;
  *(undefined1 *)(e + 2) = 1;
  e[4] = 0;
  e[5] = 0;
  e[6] = 0;
  e[7] = 0;
  puVar4 = (uint *)add234(cs->xchannels_by_us,e);
  if (puVar4 == e) {
    puVar4 = (uint *)add234(cs->xchannels_by_server,e);
    if (puVar4 == e) goto LAB_00137bbe;
    del234(cs->xchannels_by_us,e);
  }
  safefree(e);
  e = (uint *)0x0;
LAB_00137bbe:
  data = x11_make_greeting(endian,protomajor,protominor,chan->x11_auth_proto,chan->x11_auth_data,
                           chan->x11_auth_datalen,peer_addr,peer_port,&greeting_len);
  psVar5 = strbuf_new_nm();
  pBVar1 = psVar5->binarysink_;
  BinarySink_put_uint32(pBVar1,0);
  BinarySink_put_uint32(pBVar1,(long)greeting_len + (long)initial_len);
  BinarySink_put_data(pBVar1,data,(long)greeting_len);
  BinarySink_put_data(pBVar1,initial_data,(long)initial_len);
  safefree(data);
  __src = psVar5->s;
  iVar3 = (int)psVar5->len;
  puVar6 = (undefined8 *)safemalloc(1,0x20,(long)iVar3);
  puVar6[2] = puVar6 + 4;
  *(int *)(puVar6 + 3) = iVar3;
  *(undefined4 *)(puVar6 + 1) = 0x5e;
  memcpy(puVar6 + 4,__src,(long)iVar3);
  puVar4 = e + 4;
  if (*(uint **)(e + 6) != (uint *)0x0) {
    puVar4 = *(uint **)(e + 6);
  }
  *(undefined8 **)puVar4 = puVar6;
  *puVar6 = 0;
  *(undefined8 **)(e + 6) = puVar6;
  strbuf_free(psVar5);
  e[3] = client_adjusted_window + greeting_len;
  psVar5 = strbuf_new();
  pBVar1 = psVar5->binarysink_;
  BinarySink_put_stringz(pBVar1,"x11");
  BinarySink_put_uint32(pBVar1,(ulong)server_id);
  BinarySink_put_uint32(pBVar1,(ulong)server_currwin);
  BinarySink_put_uint32(pBVar1,(ulong)server_maxpkt);
  BinarySink_put_stringz(pBVar1,peer_addr);
  BinarySink_put_uint32(pBVar1,(long)peer_port);
  send_packet_to_downstream(cs,0x5a,psVar5->s,(int)psVar5->len,(share_channel *)0x0);
  strbuf_free(psVar5);
  if (chan->x11_one_shot == true) {
    pCVar2 = cs->parent->cl;
    (*pCVar2->vt->remove_sharing_x11_display)(pCVar2,chan->x11_auth_upstream);
    chan->x11_auth_upstream = (X11FakeAuth *)0x0;
    safefree(chan->x11_auth_data);
    chan->x11_auth_proto = -1;
    chan->x11_auth_datalen = 0;
    chan->x11_one_shot = false;
  }
  return;
}

Assistant:

void share_setup_x11_channel(ssh_sharing_connstate *cs, share_channel *chan,
                             unsigned upstream_id, unsigned server_id,
                             unsigned server_currwin, unsigned server_maxpkt,
                             unsigned client_adjusted_window,
                             const char *peer_addr, int peer_port, int endian,
                             int protomajor, int protominor,
                             const void *initial_data, int initial_len)
{
    struct share_xchannel *xc;
    void *greeting;
    int greeting_len;
    strbuf *packet;

    /*
     * Create an xchannel containing data we've already received from
     * the X client, and preload it with a CHANNEL_DATA message
     * containing our own made-up authorisation greeting and any
     * additional data sent from the server so far.
     */
    xc = share_add_xchannel(cs, upstream_id, server_id);
    greeting = x11_make_greeting(endian, protomajor, protominor,
                                 chan->x11_auth_proto,
                                 chan->x11_auth_data, chan->x11_auth_datalen,
                                 peer_addr, peer_port, &greeting_len);
    packet = strbuf_new_nm();
    put_uint32(packet, 0); /* leave the channel id field unfilled - we
                            * don't know the downstream id yet */
    put_uint32(packet, greeting_len + initial_len);
    put_data(packet, greeting, greeting_len);
    put_data(packet, initial_data, initial_len);
    sfree(greeting);
    share_xchannel_add_message(xc, SSH2_MSG_CHANNEL_DATA,
                               packet->s, packet->len);
    strbuf_free(packet);

    xc->window = client_adjusted_window + greeting_len;

    /*
     * Send on a CHANNEL_OPEN to downstream.
     */
    packet = strbuf_new();
    put_stringz(packet, "x11");
    put_uint32(packet, server_id);
    put_uint32(packet, server_currwin);
    put_uint32(packet, server_maxpkt);
    put_stringz(packet, peer_addr);
    put_uint32(packet, peer_port);
    send_packet_to_downstream(cs, SSH2_MSG_CHANNEL_OPEN,
                              packet->s, packet->len, NULL);
    strbuf_free(packet);

    /*
     * If this was a once-only X forwarding, clean it up now.
     */
    if (chan->x11_one_shot) {
        ssh_remove_sharing_x11_display(cs->parent->cl,
                                       chan->x11_auth_upstream);
        chan->x11_auth_upstream = NULL;
        sfree(chan->x11_auth_data);
        chan->x11_auth_proto = -1;
        chan->x11_auth_datalen = 0;
        chan->x11_one_shot = false;
    }
}